

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O3

bool __thiscall
OpenGliderConnection::AcListLookup
          (OpenGliderConnection *this,string *sDevId,FDKeyTy *key,FDStaticData *stat)

{
  ifstream *f;
  string *psVar1;
  int iVar2;
  char *__nptr;
  pointer pcVar3;
  char cVar4;
  bool bVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  mapped_type *pmVar9;
  FDKeyType _eType;
  FDStaticData *pFVar10;
  string sFileName;
  char sErr [100];
  key_type local_118;
  FDKeyTy *local_f8;
  ulong local_f0;
  FDStaticData *local_e8;
  string *local_e0;
  char *local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  char acStack_ac [60];
  string local_70;
  string local_50;
  
  __nptr = (sDevId->_M_dataplus)._M_p;
  local_f8 = key;
  local_e0 = sDevId;
  piVar6 = __errno_location();
  iVar2 = *piVar6;
  *piVar6 = 0;
  local_f0 = strtoul(__nptr,&local_d8,0x10);
  if (local_d8 == __nptr) {
    uVar8 = std::__throw_invalid_argument("stoul");
    goto LAB_0018add6;
  }
  if (*piVar6 == 0) {
LAB_0018a98e:
    *piVar6 = iVar2;
  }
  else if (*piVar6 == 0x22) {
    std::__throw_out_of_range("stoul");
    goto LAB_0018a98e;
  }
  f = &this->ifAcList;
  local_e8 = stat;
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,dataRefs.LTPluginPath._M_dataplus._M_p,
               dataRefs.LTPluginPath._M_dataplus._M_p + dataRefs.LTPluginPath._M_string_length);
    std::__cxx11::string::append((char *)&local_118);
    std::ifstream::open((string *)f,(_Ios_Openmode)&local_118);
    if (((&this->field_0x318)[*(long *)(*(long *)f + -0x18)] & 5) != 0) {
      strerror_r(*piVar6,(char *)&local_d8,100);
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
               ,0x3c6,"AcListLookup",logERR,"Could not open \'%s\' for reading: %s",
               local_118._M_dataplus._M_p,&local_d8);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  local_d8 = (char *)0x0;
  local_d0 = 0x2020202020202020;
  uStack_c8 = 0x2020202020202020;
  local_c0 = 0x2020202020202020;
  uStack_b8 = 0x20202020;
  uStack_b4 = 0x20202020;
  uStack_b0 = 0x20202020;
  builtin_strncpy(acStack_ac,"   ",4);
  cVar4 = std::__basic_file<char>::is_open();
  if ((cVar4 == '\0') ||
     (bVar5 = FileRecLookup(f,&this->numRecAcList,local_f0,&this->minKeyAcList,&this->maxKeyAcList,
                            &local_d8,0x30), pFVar10 = local_e8, !bVar5)) {
    local_d8 = (char *)0x0;
    uStack_b0 = 0x20202020;
    builtin_strncpy(acStack_ac,"   \x01",4);
    local_c0 = 0x2020202020202020;
    uStack_b8 = 0x20202020;
    uStack_b4 = 0x20202020;
    uStack_c8 = 0x2020202020202020;
    local_d0 = 0x202020202020204f;
    pFVar10 = local_e8;
  }
  else {
    if (local_d0._1_1_ != ' ') {
      psVar1 = &local_e8->mdl;
      std::__cxx11::string::_M_replace
                ((ulong)psVar1,0,(char *)(local_e8->mdl)._M_string_length,(long)&local_d0 + 1);
      lVar7 = std::__cxx11::string::find_last_not_of((char *)psVar1,0x246096,0xffffffffffffffff);
      uVar8 = lVar7 + 1;
      if ((pFVar10->mdl)._M_string_length < uVar8) goto LAB_0018add6;
      (pFVar10->mdl)._M_string_length = uVar8;
      (pFVar10->mdl)._M_dataplus._M_p[uVar8] = '\0';
    }
    if (uStack_b8._3_1_ != ' ') {
      std::__cxx11::string::_M_replace
                ((ulong)pFVar10,0,(char *)(pFVar10->reg)._M_string_length,(long)&uStack_b8 + 3);
      lVar7 = std::__cxx11::string::find_last_not_of((char *)pFVar10,0x246096,0xffffffffffffffff);
      uVar8 = lVar7 + 1;
      if ((pFVar10->reg)._M_string_length < uVar8) goto LAB_0018add6;
      (pFVar10->reg)._M_string_length = uVar8;
      (pFVar10->reg)._M_dataplus._M_p[uVar8] = '\0';
    }
    if (acStack_ac[0] != ' ') {
      std::__cxx11::string::_M_replace
                ((ulong)&pFVar10->call,0,(char *)(pFVar10->call)._M_string_length,(ulong)acStack_ac)
      ;
      lVar7 = std::__cxx11::string::find_last_not_of
                        ((char *)&pFVar10->call,0x246096,0xffffffffffffffff);
      uVar8 = lVar7 + 1;
      if ((pFVar10->call)._M_string_length < uVar8) {
LAB_0018add6:
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                   uVar8);
      }
      (pFVar10->call)._M_string_length = uVar8;
      (pFVar10->call)._M_dataplus._M_p[uVar8] = '\0';
    }
    if ((pFVar10->mdl)._M_string_length != 0) {
      ModelIcaoType::getIcaoType(&pFVar10->mdl);
      std::__cxx11::string::_M_assign((string *)&pFVar10->acTypeIcao);
    }
  }
  cVar4 = acStack_ac[3];
  if ((acStack_ac[3] & 1U) != 0) {
    if ((acStack_ac[3] & 2U) == 0) {
      (pFVar10->reg)._M_string_length = 0;
      *(pFVar10->reg)._M_dataplus._M_p = '\0';
      (pFVar10->call)._M_string_length = 0;
      *(pFVar10->call)._M_dataplus._M_p = '\0';
      pcVar3 = (local_e0->_M_dataplus)._M_p;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,pcVar3,pcVar3 + local_e0->_M_string_length);
      std::__cxx11::string::push_back((char)&local_118);
      std::__cxx11::string::push_back((char)&local_118);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OGNAnonymousIdMapTy,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OGNAnonymousIdMapTy>_>_>
               ::operator[](&this->mapAnonymousId,&local_118);
      LTFlightData::FDKeyTy::SetKey_abi_cxx11_(&local_50,local_f8,KEY_OGN,pmVar9->anonymId);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_assign((string *)&pFVar10->call);
      local_70.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
      local_70._M_dataplus._M_p = local_118._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p == &local_118.field_2) goto LAB_0018adb2;
    }
    else {
      _eType = KEY_FLARM;
      if ((char)local_d0 != 'F') {
        _eType = (uint)((char)local_d0 == 'I') * 3 + KEY_OGN;
      }
      LTFlightData::FDKeyTy::SetKey_abi_cxx11_(&local_70,local_f8,_eType,local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0018adb2;
    }
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_0018adb2:
  return (bool)(cVar4 & 1);
}

Assistant:

bool OpenGliderConnection::AcListLookup (const std::string& sDevId,
                                         LTFlightData::FDKeyTy& key,
                                         LTFlightData::FDStaticData& stat)
{
    // device id converted to binary number
    unsigned long uDevId = std::stoul(sDevId, nullptr, 16);
    
    // If needed open the file
    if (!ifAcList.is_open()) {
        // open the input file in binary mode
        const std::string sFileName = dataRefs.GetLTPluginPath() + OGN_AC_LIST_FILE;
        ifAcList.open (sFileName, std::ios::binary | std::ios::in);
        if (!ifAcList) {
            char sErr[SERR_LEN];
            strerror_s(sErr, sizeof(sErr), errno);
            LOG_MSG(logERR, ERR_OGN_ACL_FILE_OPEN_R, sFileName.c_str(), sErr);
        }
    }
    
    // look up data in the sorted file
    OGN_DDB_RecTy rec;
    if (ifAcList.is_open() &&
        FileRecLookup (ifAcList, numRecAcList,
                       uDevId, minKeyAcList, maxKeyAcList,
                       &rec, sizeof(rec)))
    {
        // copy some information into the stat structure
        if (*rec.mdl != ' ') { stat.mdl.assign(rec.mdl,sizeof(rec.mdl)); rtrim(stat.mdl); }
        if (*rec.reg != ' ') { stat.reg.assign(rec.reg,sizeof(rec.reg)); rtrim(stat.reg); }
        if (*rec.cn  != ' ') { stat.call.assign(rec.cn,sizeof(rec.cn));  rtrim(stat.call); }
        
        // based on the model information look up an ICAO a/c type
        if (!stat.mdl.empty())
            stat.acTypeIcao = ModelIcaoType::getIcaoType(stat.mdl);
    } else {
        // clear the record again (potentially used as buffer during lookup)
        // This will also CLEAR the TRACKED and IDENTIFIED flags
        // as required for a device not found in the DDB:
        rec = OGN_DDB_RecTy();
        rec.devType = 'O';          // treat it as an OGN id from the outset
        rec.SetTracked();           // tracking a not-in-DDB device is OK
    }
    
    // If the device doesn't want to be tracked we bail
    if (!rec.IsTracked())
        return false;
    
    // *** Aircraft key type / device
    
    // If the device doesn't want to be identified -> map to generated anonymous id
    if (!rec.IsIdentified()) {
        // clear any potentially identifying information
        stat.reg.clear();
        stat.call.clear();

        // The key into the map consists of the device id and the device type
        std::string idKey (sDevId);             // device id string
        idKey += '_';                           // _
        idKey += rec.devType;                   // append device type (F or I or even O) to increase uniqueness - just in case...
        // look up or _create_ the mapping record to the generated anonymous id
        OGNAnonymousIdMapTy& anon = mapAnonymousId[idKey];
        // take over the mapped anonymous id
        key.SetKey(LTFlightData::KEY_OGN, anon.anonymId);
        stat.call = anon.anonymCall;
    } else {
        // device is allowed to be identified
        key.SetKey(rec.devType == 'F' ? LTFlightData::KEY_FLARM    :
                   rec.devType == 'I' ? LTFlightData::KEY_ICAO     : LTFlightData::KEY_OGN,
                   uDevId);
    }
    
    // is allowed to be tracked, ie. is visible
    return true;
}